

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O2

int mk_utils_hex2int(char *hex,int len)

{
  char cVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  lVar2 = 0;
  iVar3 = 0;
  while( true ) {
    cVar1 = hex[lVar2];
    iVar4 = (int)cVar1;
    if ((cVar1 == '\0') || (len <= (int)lVar2)) break;
    iVar3 = iVar3 * 0x10;
    if ((byte)(cVar1 + 0x9fU) < 6) {
      iVar3 = iVar3 + iVar4 + -0x57;
    }
    else if ((byte)(cVar1 + 0xbfU) < 6) {
      iVar3 = iVar3 + iVar4 + -0x37;
    }
    else {
      if (9 < (byte)(cVar1 - 0x30U)) {
        return -1;
      }
      iVar3 = iVar3 + iVar4 + -0x30;
    }
    lVar2 = lVar2 + 1;
  }
  iVar4 = -1;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  return iVar4;
}

Assistant:

int mk_utils_hex2int(char *hex, int len)
{
    int i = 0;
    int res = 0;
    char c;

    while ((c = *hex++) && i < len) {
        res *= 0x10;

        if (c >= 'a' && c <= 'f') {
            res += (c - 0x57);
        }
        else if (c >= 'A' && c <= 'F') {
            res += (c - 0x37);
        }
        else if (c >= '0' && c <= '9') {
            res += (c - 0x30);
        }
        else {
            return -1;
        }
        i++;
    }

    if (res < 0) {
        return -1;
    }

    return res;
}